

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O0

void miniwalk(int x,int y)

{
  int iVar1;
  long lVar2;
  int dirs [4];
  int dir;
  int q;
  int y_local;
  int x_local;
  
  dir = y;
  q = x;
  while( true ) {
    dirs[3] = 0;
    if (((0 < q) && ((r[q][dir].doortable & 4) == 0)) &&
       ((r[q + -1][dir].doortable == '\0' || (iVar1 = rn2(10), iVar1 == 0)))) {
      lVar2 = (long)dirs[3];
      dirs[3] = dirs[3] + 1;
      dirs[lVar2 + -2] = 0;
    }
    if (((q < 2) && ((r[q][dir].doortable & 8) == 0)) &&
       ((r[q + 1][dir].doortable == '\0' || (iVar1 = rn2(10), iVar1 == 0)))) {
      lVar2 = (long)dirs[3];
      dirs[3] = dirs[3] + 1;
      dirs[lVar2 + -2] = 1;
    }
    if (((0 < dir) && ((r[q][dir].doortable & 1) == 0)) &&
       ((r[q][dir + -1].doortable == '\0' || (iVar1 = rn2(10), iVar1 == 0)))) {
      lVar2 = (long)dirs[3];
      dirs[3] = dirs[3] + 1;
      dirs[lVar2 + -2] = 2;
    }
    if (((dir < 2) && ((r[q][dir].doortable & 2) == 0)) &&
       ((r[q][dir + 1].doortable == '\0' || (iVar1 = rn2(10), iVar1 == 0)))) {
      lVar2 = (long)dirs[3];
      dirs[3] = dirs[3] + 1;
      dirs[lVar2 + -2] = 3;
    }
    if (dirs[3] == 0) break;
    iVar1 = rn2(dirs[3]);
    dirs[2] = dirs[(long)iVar1 + -2];
    switch(dirs[2]) {
    case 0:
      r[q][dir].doortable = r[q][dir].doortable | 4;
      q = q + -1;
      r[q][dir].doortable = r[q][dir].doortable | 8;
      break;
    case 1:
      r[q][dir].doortable = r[q][dir].doortable | 8;
      q = q + 1;
      r[q][dir].doortable = r[q][dir].doortable | 4;
      break;
    case 2:
      r[q][dir].doortable = r[q][dir].doortable | 1;
      dir = dir + -1;
      r[q][dir].doortable = r[q][dir].doortable | 2;
      break;
    case 3:
      r[q][dir].doortable = r[q][dir].doortable | 2;
      dir = dir + 1;
      r[q][dir].doortable = r[q][dir].doortable | 1;
    }
    miniwalk(q,dir);
  }
  return;
}

Assistant:

static void miniwalk(int x, int y)
{
	int q, dir;
	int dirs[4];

	while (1) {
		q = 0;
#define doorhere (r[x][y].doortable)
		if (x>0 && (!(doorhere & LEFT)) &&
					(!r[x-1][y].doortable || !rn2(10)))
			dirs[q++] = 0;
		if (x<2 && (!(doorhere & RIGHT)) &&
					(!r[x+1][y].doortable || !rn2(10)))
			dirs[q++] = 1;
		if (y>0 && (!(doorhere & UP)) &&
					(!r[x][y-1].doortable || !rn2(10)))
			dirs[q++] = 2;
		if (y<2 && (!(doorhere & DOWN)) &&
					(!r[x][y+1].doortable || !rn2(10)))
			dirs[q++] = 3;
	/* Rogue levels aren't just 3 by 3 mazes; they have some extra
	 * connections, thus that 1/10 chance
	 */
		if (!q) return;
		dir = dirs[rn2(q)];
		switch(dir) { /* Move in direction */
			case 0: doorhere |= LEFT;
				x--;
				doorhere |= RIGHT;
				break;
			case 1: doorhere |= RIGHT;
				x++;
				doorhere |= LEFT;
				break;
			case 2: doorhere |= UP;
				y--;
				doorhere |= DOWN;
				break;
			case 3: doorhere |= DOWN;
				y++;
				doorhere |= UP;
				break;
		}
		miniwalk(x,y);
	}
}